

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomicFile.cpp
# Opt level: O3

void __thiscall AtomicFile::impl::finalize(impl *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  string *__return_storage_ptr__;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->is_temp_active == true) && (allow_atomics)) {
    bVar3 = Path::exists(&(this->temp_file).super_Path);
    paVar1 = &local_f0.field_2;
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    if (bVar3) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"Moving \'{1}\' -> \'{2}\'","");
      pcVar2 = (this->temp_file).super_Path._data._M_dataplus._M_p;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar2,
                 pcVar2 + (this->temp_file).super_Path._data._M_string_length);
      pcVar2 = (this->real_file).super_Path._data._M_dataplus._M_p;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar2,
                 pcVar2 + (this->real_file).super_Path._data._M_string_length);
      format<std::__cxx11::string,std::__cxx11::string>(&local_110,&local_f0,&local_90,&local_b0);
      debug(&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      iVar4 = rename((this->temp_file).super_Path._data._M_dataplus._M_p,
                     (this->real_file).super_Path._data._M_dataplus._M_p);
      if (iVar4 != 0) {
        __return_storage_ptr__ = (string *)__cxa_allocate_exception(0x20);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,
                   "Failed copying \'{1}\' to \'{2}\'. Database corruption possible.","");
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar2 = (this->temp_file).super_Path._data._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,
                   pcVar2 + (this->temp_file).super_Path._data._M_string_length);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        pcVar2 = (this->real_file).super_Path._data._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar2,
                   pcVar2 + (this->real_file).super_Path._data._M_string_length);
        format<std::__cxx11::string,std::__cxx11::string>
                  (__return_storage_ptr__,&local_110,&local_50,&local_70);
        __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                    std::__cxx11::string::~string);
      }
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Removing \'{1}\'","");
      pcVar2 = (this->real_file).super_Path._data._M_dataplus._M_p;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,pcVar2,
                 pcVar2 + (this->real_file).super_Path._data._M_string_length);
      format<std::__cxx11::string>(&local_110,&local_f0,&local_d0);
      debug(&local_110);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      ::remove((this->real_file).super_Path._data._M_dataplus._M_p);
    }
    this->is_temp_active = false;
  }
  return;
}

Assistant:

void AtomicFile::impl::finalize ()
{
  if (is_temp_active && impl::allow_atomics)
  {
    if (temp_file.exists ())
    {
      debug (format ("Moving '{1}' -> '{2}'", temp_file._data, real_file._data));
      if (std::rename (temp_file._data.c_str (), real_file._data.c_str ()))
      {
        throw format("Failed copying '{1}' to '{2}'. Database corruption possible.",
            temp_file._data, real_file._data);
      }
    }
    else
    {
      debug (format ("Removing '{1}'", real_file._data));
      std::remove (real_file._data.c_str ());
    }
    is_temp_active = false;
  }
}